

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

bool __thiscall Rml::Context::Update(Context *this)

{
  float dp_ratio;
  bool bVar1;
  int iVar2;
  pointer this_00;
  reference ppVar3;
  pointer this_01;
  pointer pEVar4;
  Element *this_02;
  ElementDocument *this_03;
  ElementPtr *this_04;
  double dVar5;
  Vector2<float> vp_dimensions;
  ElementDocument *doc;
  int i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>_>
  *data_model;
  iterator __end1;
  iterator __begin1;
  DataModels *__range1;
  Context *this_local;
  
  dVar5 = ::std::numeric_limits<double>::infinity();
  this->next_update_timeout = dVar5;
  this_00 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
            operator->(&this->scroll_controller);
  bVar1 = ScrollController::Update
                    (this_00,this->mouse_position,this->density_independent_pixel_ratio);
  if (bVar1) {
    RequestNextUpdate(this,0.0);
  }
  if ((this->mouse_active & 1U) != 0) {
    UpdateHoverChain(this,this->mouse_position,0,(Dictionary *)0x0,(Dictionary *)0x0);
  }
  join_0x00000010_0x00000000_ =
       robin_hood::detail::
       Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->data_models);
  _data_model = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(&this->data_models);
  while (bVar1 = robin_hood::detail::
                 Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::DataModel,std::default_delete<Rml::DataModel>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                 ::Iter<false>::operator!=((Iter<false> *)&__end1.mInfo,(Iter<false> *)&data_model),
        bVar1) {
    ppVar3 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Iter<false>::operator*((Iter<false> *)&__end1.mInfo);
    this_01 = ::std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>::operator->
                        (&ppVar3->second);
    DataModel::Update(this_01,true);
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::DataModel,_std::default_delete<Rml::DataModel>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<false>::operator++((Iter<false> *)&__end1.mInfo);
  }
  this_04 = &this->root;
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_04);
  pEVar4->field_0x17 = pEVar4->field_0x17 & 0xfd;
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_04);
  pEVar4->field_0x17 = pEVar4->field_0x17 & 0xfb;
  pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_04);
  dp_ratio = this->density_independent_pixel_ratio;
  vp_dimensions = Vector2::operator_cast_to_Vector2((Vector2 *)&this->dimensions);
  Element::Update(pEVar4,dp_ratio,vp_dimensions);
  doc._4_4_ = 0;
  while( true ) {
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    iVar2 = Element::GetNumChildren(pEVar4,false);
    if (iVar2 <= doc._4_4_) break;
    pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(&this->root);
    this_02 = Element::GetChild(pEVar4,doc._4_4_);
    this_03 = Element::GetOwnerDocument(this_02);
    if (this_03 != (ElementDocument *)0x0) {
      ElementDocument::UpdateLayout(this_03);
      ElementDocument::UpdatePosition(this_03);
    }
    doc._4_4_ = doc._4_4_ + 1;
  }
  ReleaseUnloadedDocuments(this);
  return true;
}

Assistant:

bool Context::Update()
{
	RMLUI_ZoneScoped;

	next_update_timeout = std::numeric_limits<double>::infinity();

	if (scroll_controller->Update(mouse_position, density_independent_pixel_ratio))
		RequestNextUpdate(0);

	// Update the hover chain to detect any new or moved elements under the mouse.
	if (mouse_active)
		UpdateHoverChain(mouse_position);

	// Update all the data models before updating properties and layout.
	for (auto& data_model : data_models)
		data_model.second->Update(true);

	// The style definition of each document should be independent of each other. By manually resetting these flags we avoid unnecessary definition
	// lookups in unrelated documents, such as when adding a new document. Adding an element dirties the parent definition, which in this case is the
	// root. By extension the definition of all the other documents are also dirtied, unnecessarily.
	root->dirty_definition = false;
	root->dirty_child_definitions = false;

	root->Update(density_independent_pixel_ratio, Vector2f(dimensions));

	for (int i = 0; i < root->GetNumChildren(); ++i)
	{
		if (auto doc = root->GetChild(i)->GetOwnerDocument())
		{
			doc->UpdateLayout();
			doc->UpdatePosition();
		}
	}

	// Release any documents that were unloaded during the update.
	ReleaseUnloadedDocuments();

	return true;
}